

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThreadPool.cpp
# Opt level: O0

EventLoop * __thiscall higan::EventLoopThreadPool::GetNextEventLoop(EventLoopThreadPool *this)

{
  undefined8 uVar1;
  reference ppEVar2;
  value_type local_340;
  EventLoop *result;
  Fmt local_328;
  Logger local_228;
  EventLoopThreadPool *local_10;
  EventLoopThreadPool *this_local;
  
  local_10 = this;
  if ((this->running_ & 1U) == 0) {
    Logger::Logger(&local_228,FATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/EventLoopThreadPool.cpp"
                   ,0x2e,"GetNextEventLoop");
    uVar1 = std::__cxx11::string::c_str();
    Fmt::Fmt(&local_328,"EventLoopThreadPool %s hadn\'t started",uVar1);
    Logger::operator<<(&local_228,&local_328);
    Logger::~Logger(&local_228);
  }
  ppEVar2 = std::vector<higan::EventLoop_*,_std::allocator<higan::EventLoop_*>_>::operator[]
                      (&this->event_loops_,0);
  local_340 = *ppEVar2;
  if (this->thread_num_ != 0) {
    ppEVar2 = std::vector<higan::EventLoop_*,_std::allocator<higan::EventLoop_*>_>::operator[]
                        (&this->event_loops_,GetNextEventLoop::event_loop_sub);
    local_340 = *ppEVar2;
    GetNextEventLoop::event_loop_sub =
         GetNextEventLoop::event_loop_sub % (ulong)(long)this->thread_num_ + 1;
  }
  return local_340;
}

Assistant:

EventLoop* EventLoopThreadPool::GetNextEventLoop()
{
	if (!running_)
	{
		LOG_FATAL << higan::Fmt("EventLoopThreadPool %s hadn't started", name_.c_str());
	}

	EventLoop* result = event_loops_[0];

	if (thread_num_ != 0)
	{
		static size_t event_loop_sub = 1;
		result = event_loops_[event_loop_sub];

		event_loop_sub = event_loop_sub % thread_num_ + 1;
	}

	return result;
}